

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  uint *count;
  uint uVar1;
  uint uVar2;
  void *workspace_00;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong srcSize;
  char *buffer;
  uint local_6c;
  FSE_CTable *local_68;
  size_t local_60;
  FSE_CTable *local_58;
  void *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  local_60 = maxDstSize;
  workspace_00 = HUF_alignUpWorkspace(workspace,&workspaceSize,4);
  if (workspaceSize < 0x2ec) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace_00 + 0x1e0) = 0;
  uVar1 = huffLog + 1;
  for (lVar5 = 0x1e1; lVar5 - 0x1e0U < (ulong)uVar1; lVar5 = lVar5 + 1) {
    *(char *)((long)workspace_00 + lVar5) = (char)huffLog;
    huffLog = (uint)(byte)((char)huffLog - 1);
  }
  local_50 = (void *)((long)workspace_00 + 0x1ed);
  srcSize = (ulong)maxSymbolValue;
  for (uVar3 = 0; srcSize != uVar3; uVar3 = uVar3 + 1) {
    *(undefined1 *)((long)workspace_00 + uVar3 + 0x1ed) =
         *(undefined1 *)((long)workspace_00 + (ulong)(byte)CTable[uVar3 + 1] + 0x1e0);
  }
  if (local_60 == 0) {
    return 0xffffffffffffffba;
  }
  local_38 = 0x1e0;
  local_6c = 0xc;
  local_68 = (FSE_CTable *)HUF_alignUpWorkspace(workspace_00,&local_38,4);
  if (local_38 < 0x1e0) {
    return 0xffffffffffffffff;
  }
  buffer = (char *)((long)dst + 1);
  if (1 < maxSymbolValue) {
    count = local_68 + 100;
    uVar2 = HIST_count_simple(count,&local_6c,local_50,srcSize);
    uVar1 = local_6c;
    if (uVar2 == maxSymbolValue) {
      pcVar7 = (char *)0x1;
      goto LAB_0013c3b6;
    }
    if (uVar2 != 1) {
      uVar2 = FSE_optimalTableLog(6,srcSize,local_6c);
      local_58 = local_68 + 0x71;
      sVar4 = FSE_normalizeCount((short *)local_58,uVar2,count,srcSize,uVar1,0);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      local_40 = local_60 - 1;
      local_48 = FSE_writeNCount(buffer,local_40,(short *)local_58,uVar1,uVar2);
      if (0xffffffffffffff88 < local_48) {
        return local_48;
      }
      sVar4 = FSE_buildCTable_wksp(local_68,(short *)local_58,uVar1,uVar2,local_68 + 0x3b,0xa4);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      pcVar7 = buffer + local_48;
      sVar4 = FSE_compress_usingCTable(pcVar7,local_40 - local_48,local_50,srcSize,local_68);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      if (sVar4 != 0) {
        pcVar7 = pcVar7 + (sVar4 - (long)buffer);
        if ((char *)0xffffffffffffff88 < pcVar7) {
          return (size_t)pcVar7;
        }
        goto LAB_0013c3b6;
      }
    }
  }
  pcVar7 = (char *)0x0;
LAB_0013c3b6:
  if (pcVar7 < (char *)(ulong)(maxSymbolValue >> 1) && (char *)0x1 < pcVar7) {
    *(char *)dst = (char)pcVar7;
    return (size_t)(pcVar7 + 1);
  }
  if (0x80 < maxSymbolValue) {
    return 0xffffffffffffffff;
  }
  uVar3 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
  if (uVar3 <= local_60) {
    *(char *)dst = (char)maxSymbolValue + '\x7f';
    *(undefined1 *)((long)workspace_00 + srcSize + 0x1ed) = 0;
    for (uVar6 = 0; uVar6 < srcSize; uVar6 = uVar6 + 2) {
      *buffer = *(char *)((long)workspace_00 + uVar6 + 0x1ed) * '\x10' +
                *(char *)((long)workspace_00 + uVar6 + 0x1ee);
      buffer = buffer + 1;
    }
    return uVar3;
  }
  return 0xffffffffffffffba;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    HUF_CElt const* const ct = CTable + 1;
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)HUF_alignUpWorkspace(workspace, &workspaceSize, ZSTD_ALIGNOF(U32));

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE >= sizeof(HUF_WriteCTableWksp));

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[HUF_getNbBits(ct[n])];

    /* attempt weights compression by FSE */
    if (maxDstSize < 1) return ERROR(dstSize_tooSmall);
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}